

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O3

void initialize_states(void)

{
  uint *puVar1;
  Yshort *pYVar2;
  uint uVar3;
  core *pcVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  puVar1 = (uint *)derives[start_symbol];
  uVar7 = 0x1c;
  iVar6 = -1;
  do {
    iVar6 = iVar6 + 1;
    lVar5 = uVar7 - 0x1c;
    uVar7 = uVar7 + 4;
  } while (-1 < *(int *)((long)puVar1 + lVar5));
  pcVar4 = (core *)malloc(uVar7 & 0xffffffff);
  if (pcVar4 == (core *)0x0) {
    no_space();
  }
  pcVar4->next = (core *)0x0;
  pcVar4->link = (core *)0x0;
  pcVar4->number = 0;
  pcVar4->accessing_symbol = 0;
  pcVar4->nitems = iVar6;
  pYVar2 = rrhs;
  uVar3 = *puVar1;
  if (-1 < (int)uVar3) {
    lVar5 = 0;
    do {
      *(Yshort *)((long)pcVar4->items + lVar5) = pYVar2[uVar3];
      uVar3 = *(uint *)((long)puVar1 + lVar5 + 4);
      lVar5 = lVar5 + 4;
    } while (-1 < (int)uVar3);
  }
  this_state = pcVar4;
  last_state = pcVar4;
  first_state = pcVar4;
  nstates = 1;
  return;
}

Assistant:

void initialize_states()
{
    register int i;
    register Yshort *start_derives;
    register core *p;

    start_derives = derives[start_symbol];
    for (i = 0; start_derives[i] >= 0; ++i)
	continue;

    p = (core *) MALLOC(sizeof(core) + i*sizeof(Yshort));
    if (p == 0) no_space();

    p->next = 0;
    p->link = 0;
    p->number = 0;
    p->accessing_symbol = 0;
    p->nitems = i;

    for (i = 0;  start_derives[i] >= 0; ++i)
	p->items[i] = rrhs[start_derives[i]];

    first_state = last_state = this_state = p;
    nstates = 1;
}